

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_raw.c
# Opt level: O0

ssize_t archive_write_raw_data(archive_write *a,void *buff,size_t s)

{
  int iVar1;
  archive_write *in_RDX;
  int ret;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined8 local_8;
  
  iVar1 = __archive_write_output
                    (in_RDX,(void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     0x18b757);
  local_8 = in_RDX;
  if (iVar1 < 0) {
    local_8 = (archive_write *)(long)iVar1;
  }
  return (ssize_t)local_8;
}

Assistant:

static ssize_t
archive_write_raw_data(struct archive_write *a, const void *buff, size_t s)
{
	int ret;

	ret = __archive_write_output(a, buff, s);
	if (ret >= 0)
		return (s);
	else
		return (ret);
}